

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::MethodDescriptorProto::SharedCtor(MethodDescriptorProto *this)

{
  this->_cached_size_ = 0;
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->input_type_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->output_type_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (MethodOptions *)0x0;
  this->client_streaming_ = false;
  this->server_streaming_ = false;
  return;
}

Assistant:

void MethodDescriptorProto::SharedCtor() {
  _cached_size_ = 0;
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  input_type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  output_type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&options_, 0, reinterpret_cast<char*>(&server_streaming_) -
    reinterpret_cast<char*>(&options_) + sizeof(server_streaming_));
}